

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_object_isSealed(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int is_frozen)

{
  int64_t iVar1;
  int iVar2;
  uint uVar3;
  int64_t iVar4;
  JSValueUnion JVar5;
  ulong uVar6;
  JSPropertyEnum *tab;
  JSValue obj;
  JSValue JVar7;
  uint32_t len;
  JSPropertyEnum *props;
  JSPropertyDescriptor desc;
  uint local_74;
  JSPropertyEnum *local_70;
  JSPropertyDescriptor local_68;
  
  iVar1 = argv->tag;
  iVar4 = 1;
  if ((int)iVar1 != -1) {
    JVar5.float64 = 4.94065645841247e-324;
    goto LAB_0015f5d7;
  }
  JVar5 = (JSValueUnion)(argv->u).ptr;
  iVar2 = JS_GetOwnPropertyNamesInternal(ctx,&local_70,&local_74,(JSObject *)JVar5.ptr,3);
  tab = local_70;
  if (iVar2 == 0) {
    if ((ulong)local_74 != 0) {
      uVar6 = 0;
      do {
        iVar2 = JS_GetOwnPropertyInternal(ctx,&local_68,(JSObject *)JVar5.ptr,tab[uVar6].atom);
        if (iVar2 < 0) {
          js_free_prop_enum(ctx,tab,local_74);
          goto LAB_0015f52e;
        }
        if ((iVar2 != 0) &&
           ((js_free_desc(ctx,&local_68), (local_68.flags & 1U) != 0 ||
            ((local_68.flags & 2U) != 0 && is_frozen != 0)))) {
          JVar5.float64 = 0.0;
          goto LAB_0015f5c2;
        }
        uVar6 = uVar6 + 1;
      } while (local_74 != uVar6);
    }
    if (*(short *)((long)JVar5.ptr + 6) == 0x29) {
      obj.tag = iVar1;
      obj.u.ptr = JVar5.ptr;
      uVar3 = js_proxy_isExtensible(ctx,obj);
      if ((int)uVar3 < 0) goto LAB_0015f52e;
    }
    else {
      uVar3 = *(byte *)((long)JVar5.ptr + 5) & 1;
    }
    JVar5._1_7_ = 0;
    JVar5.int32._0_1_ = uVar3 != 1;
    tab = local_70;
LAB_0015f5c2:
    js_free_prop_enum(ctx,tab,local_74);
    iVar4 = 1;
  }
  else {
LAB_0015f52e:
    JVar5.float64 = 0.0;
    iVar4 = 6;
  }
LAB_0015f5d7:
  JVar7.tag = iVar4;
  JVar7.u.float64 = JVar5.float64;
  return JVar7;
}

Assistant:

static JSValue js_object_isSealed(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv, int is_frozen)
{
    JSValueConst obj = argv[0];
    JSObject *p;
    JSPropertyEnum *props;
    uint32_t len, i;
    int flags, res;
    
    if (!JS_IsObject(obj))
        return JS_TRUE;

    p = JS_VALUE_GET_OBJ(obj);
    flags = JS_GPN_STRING_MASK | JS_GPN_SYMBOL_MASK;
    if (JS_GetOwnPropertyNamesInternal(ctx, &props, &len, p, flags))
        return JS_EXCEPTION;

    for(i = 0; i < len; i++) {
        JSPropertyDescriptor desc;
        JSAtom prop = props[i].atom;

        res = JS_GetOwnPropertyInternal(ctx, &desc, p, prop);
        if (res < 0)
            goto exception;
        if (res) {
            js_free_desc(ctx, &desc);
            if ((desc.flags & JS_PROP_CONFIGURABLE)
            ||  (is_frozen && (desc.flags & JS_PROP_WRITABLE))) {
                res = FALSE;
                goto done;
            }
        }
    }
    res = JS_IsExtensible(ctx, obj);
    if (res < 0)
        return JS_EXCEPTION;
    res ^= 1;
done:        
    js_free_prop_enum(ctx, props, len);
    return JS_NewBool(ctx, res);

exception:
    js_free_prop_enum(ctx, props, len);
    return JS_EXCEPTION;
}